

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O1

int ImfHeaderSetM33fAttribute(ImfHeader *hdr,char *name,float (*m) [3])

{
  Iterator IVar1;
  iterator iVar2;
  TypedAttribute<Imath_3_2::Matrix33<float>_> *pTVar3;
  Matrix33<float> local_78;
  TypedAttribute<Imath_3_2::Matrix33<float>_> local_48;
  
  local_78.x[0]._0_8_ = *(undefined8 *)*m;
  local_78.x._8_8_ = *(undefined8 *)(*m + 2);
  local_78.x[1]._4_8_ = *(undefined8 *)(m[1] + 1);
  local_78.x[2]._0_8_ = *(undefined8 *)m[2];
  local_78.x[2][2] = m[2][2];
  IVar1 = Imf_3_4::Header::find((Header *)hdr,name);
  iVar2._M_node = (_Base_ptr)Imf_3_4::Header::end((Header *)hdr);
  if (IVar1._i._M_node == (iterator)iVar2._M_node) {
    Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::TypedAttribute(&local_48,&local_78);
    Imf_3_4::Header::insert((Header *)hdr,name,&local_48.super_Attribute);
    Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::~TypedAttribute(&local_48);
  }
  else {
    pTVar3 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>>>
                       ((Header *)hdr,name);
    *(undefined8 *)(pTVar3->_value).x[0] = local_78.x[0]._0_8_;
    *(undefined8 *)((pTVar3->_value).x[0] + 2) = local_78.x._8_8_;
    *(undefined8 *)((pTVar3->_value).x[1] + 1) = local_78.x[1]._4_8_;
    *(undefined8 *)(pTVar3->_value).x[2] = local_78.x[2]._0_8_;
    (pTVar3->_value).x[2][2] = local_78.x[2][2];
  }
  return 1;
}

Assistant:

int
ImfHeaderSetM33fAttribute (
    ImfHeader* hdr, const char name[], const float m[3][3])
{
    try
    {
        M33f m3 (m);

        if (header (hdr)->find (name) == header (hdr)->end ())
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::M33fAttribute (m3));
        else
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::M33fAttribute> (name)
                .value () = m3;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}